

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_reporter.c
# Opt level: O2

void text_reporter_finish_suite(TestReporter *reporter,char *file,int line)

{
  undefined8 *puVar1;
  void *pvVar2;
  int iVar3;
  char *pcVar4;
  undefined1 use_colors;
  char prepend [100];
  char buf [1000];
  
  pcVar4 = get_current_from_breadcrumb(reporter->breadcrumb);
  if ((undefined1 *)reporter->options == (undefined1 *)0x0) {
    use_colors = false;
  }
  else {
    use_colors = *reporter->options;
  }
  puVar1 = (undefined8 *)reporter->memo;
  reporter_finish_suite(reporter,file,line);
  reporter->total_passes = reporter->total_passes + reporter->passes;
  reporter->total_failures = reporter->total_failures + reporter->failures;
  reporter->total_skips = reporter->total_skips + reporter->skips;
  iVar3 = reporter->exceptions;
  reporter->total_exceptions = reporter->total_exceptions + iVar3;
  if ((reporter->options == (void *)0x0) || (*(char *)((long)reporter->options + 1) != '\x01')) {
    __sprintf_chk(prepend,1,100,"  \"%s\": ",pcVar4);
    text_reporter_print_results
              (buf,prepend,reporter->passes,reporter->failures,reporter->skips,reporter->exceptions,
               reporter->duration,(_Bool)use_colors);
    iVar3 = get_breadcrumb_depth(reporter->breadcrumb);
    if (((iVar3 != 0) ||
        (((reporter->passes != 0 || (reporter->failures != 0)) || (reporter->skips != 0)))) ||
       (reporter->exceptions != 0)) {
      (*(code *)*puVar1)("%s.\n",buf);
    }
    iVar3 = get_breadcrumb_depth(reporter->breadcrumb);
    if (iVar3 != 0) {
      return;
    }
    pvVar2 = reporter->options;
    if (pvVar2 != (void *)0x0) {
      if (*(char *)((long)pvVar2 + 1) != '\0') {
        return;
      }
      if (*(char *)((long)pvVar2 + 3) != '\0') {
        return;
      }
    }
    __sprintf_chk(prepend,1,100,"Completed \"%s\": ",pcVar4);
    text_reporter_print_results
              (buf,prepend,reporter->total_passes,reporter->total_failures,reporter->total_skips,
               reporter->total_exceptions,reporter->total_duration,(_Bool)use_colors);
    (*(code *)*puVar1)("%s.\n",buf);
    return;
  }
  if ((_Bool)use_colors == false) {
LAB_0010be64:
    if (iVar3 != 0) {
      (*(code *)*puVar1)("X");
      goto LAB_0010bf9d;
    }
  }
  else {
    (*(code *)*puVar1)("\x1b[32m");
    if (reporter->failures != 0) {
      (*(code *)*puVar1)("\x1b[31m");
    }
    if (reporter->exceptions != 0) {
      (*(code *)*puVar1)("\x1b[35m");
      iVar3 = reporter->exceptions;
      goto LAB_0010be64;
    }
  }
  if (reporter->failures == 0) {
    pcVar4 = ".";
  }
  else {
    pcVar4 = "F";
  }
  (*(code *)*puVar1)(pcVar4);
LAB_0010bf9d:
  if ((_Bool)use_colors == false) {
    return;
  }
  (*(code *)*puVar1)("\x1b[0m");
  return;
}

Assistant:

static void text_reporter_finish_suite(TestReporter *reporter, const char *file, int line) {
    const char *name = get_current_from_breadcrumb((CgreenBreadcrumb *) reporter->breadcrumb);
    bool use_colors = reporter->options && ((TextReporterOptions *)reporter->options)->use_colours;
    TextMemo *memo = (TextMemo *)reporter->memo;

    reporter_finish_suite(reporter, file, line);

    reporter->total_passes += reporter->passes;
    reporter->total_failures += reporter->failures;
    reporter->total_skips += reporter->skips;
    reporter->total_exceptions += reporter->exceptions;

    if (have_quiet_mode(reporter)) {
        if (use_colors) {
            memo->printer(GREEN);
            if (reporter->failures) memo->printer(RED);
            if (reporter->exceptions) memo->printer(MAGENTA);
        }
        if (reporter->exceptions) memo->printer("X");
        else if (reporter->failures) memo->printer("F");
        else memo->printer(".");
        if (use_colors) {
            memo->printer(RESET);
        }
    } else {
        char buf[1000];
        char prepend[100];

        sprintf(prepend, "  \"%s\": ", name);
        text_reporter_print_results(buf, prepend,
                reporter->passes,
                reporter->failures,
                reporter->skips,
                reporter->exceptions,
                reporter->duration,
                use_colors);

        // Don't report top-level (pseudo-suite) if it had no asserts at all
        if (get_breadcrumb_depth((CgreenBreadcrumb *) reporter->breadcrumb) != 0 ||
                (reporter->passes || reporter->failures || reporter->skips || reporter->exceptions)) {
            memo->printer("%s.\n", buf);
        }

        // Report totals
        if (get_breadcrumb_depth((CgreenBreadcrumb *) reporter->breadcrumb) == 0) {
            if (!have_quiet_mode(reporter) && !inhibit_finish_suite_message(reporter)) {
                sprintf(prepend, "Completed \"%s\": ", name);
                text_reporter_print_results(buf, prepend,
                                            reporter->total_passes,
                                            reporter->total_failures,
                                            reporter->total_skips,
                                            reporter->total_exceptions,
                                            reporter->total_duration,
                                            use_colors);
                memo->printer("%s.\n", buf);
            }
        }
    }
}